

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

Gnuplot * __thiscall Gnuplot::showonscreen(Gnuplot *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator local_31;
  string local_30;
  Gnuplot *local_10;
  Gnuplot *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"set output",&local_31);
  cmd(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::operator+(&local_68,"set terminal ",&terminal_std_abi_cxx11_);
  cmd(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return this;
}

Assistant:

Gnuplot& Gnuplot::showonscreen() {
  cmd("set output");
  cmd("set terminal "+ Gnuplot::terminal_std);
  return *this;
}